

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_char(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int arg;
  ulong uVar5;
  luaL_Buffer b;
  
  uVar1 = lua_gettop(L);
  pcVar2 = luaL_buffinitsize(L,&b,(long)(int)uVar1);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while (uVar4 != uVar5) {
    arg = (int)(uVar5 + 1);
    uVar3 = luaL_checkinteger(L,arg);
    if (0xff < uVar3) {
      luaL_argerror(L,arg,"value out of range");
    }
    pcVar2[uVar5] = (char)uVar3;
    uVar5 = uVar5 + 1;
  }
  luaL_pushresultsize(&b,(long)(int)uVar1);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  char *p = luaL_buffinitsize(L, &b, n);
  for (i=1; i<=n; i++) {
    lua_Unsigned c = (lua_Unsigned)luaL_checkinteger(L, i);
    luaL_argcheck(L, c <= (lua_Unsigned)UCHAR_MAX, i, "value out of range");
    p[i - 1] = uchar(c);
  }
  luaL_pushresultsize(&b, n);
  return 1;
}